

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O2

void ZmqContextManager::startContext(string *contextName)

{
  iterator iVar1;
  ZmqContextManager *this;
  shared_ptr<ZmqContextManager> newContext;
  
  std::mutex::lock(&contextLock);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>_>
          ::find(&contexts_abi_cxx11_._M_t,contextName);
  if ((_Rb_tree_header *)iVar1._M_node == &contexts_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    this = (ZmqContextManager *)operator_new(0x30);
    ZmqContextManager(this,contextName);
    std::__shared_ptr<ZmqContextManager,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<ZmqContextManager,void>
              ((__shared_ptr<ZmqContextManager,(__gnu_cxx::_Lock_policy)2> *)&newContext,this);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<ZmqContextManager>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>>
                *)&contexts_abi_cxx11_,contextName,&newContext);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&newContext.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&contextLock);
  return;
}

Assistant:

void ZmqContextManager::startContext(const std::string& contextName)
{
    std::lock_guard<std::mutex> conlock(contextLock);
    auto fnd = contexts.find(contextName);
    if (fnd == contexts.end()) {
        auto newContext = std::shared_ptr<ZmqContextManager>(new ZmqContextManager(contextName));
        contexts.emplace(contextName, std::move(newContext));
    }
}